

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralCurveConnection::IfcStructuralCurveConnection
          (IfcStructuralCurveConnection *this)

{
  IfcStructuralCurveConnection *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcStructuralConnection).field_0x140,
             "IfcStructuralCurveConnection");
  IfcStructuralConnection::IfcStructuralConnection
            (&this->super_IfcStructuralConnection,&PTR_construction_vtable_24__00f57d10);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralCurveConnection,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralCurveConnection,_0UL> *)
             &(this->super_IfcStructuralConnection).
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>.field_0x20,
             &PTR_construction_vtable_24__00f57e48);
  *(undefined8 *)&this->super_IfcStructuralConnection = 0xf57be0;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x140 = 0xf57cf8;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x88 = 0xf57c08;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x98 = 0xf57c30;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0xd0 = 0xf57c58;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x100 = 0xf57c80;
  (this->super_IfcStructuralConnection).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xf57ca8;
  *(undefined8 *)
   &(this->super_IfcStructuralConnection).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>.field_0x20 = 0xf57cd0;
  return;
}

Assistant:

IfcStructuralCurveConnection() : Object("IfcStructuralCurveConnection") {}